

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MacroUsageSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroUsageSyntax,slang::parsing::Token,slang::syntax::MacroActualArgumentListSyntax*>
          (BumpAllocator *this,Token *args,MacroActualArgumentListSyntax **args_1)

{
  Token directive;
  MacroUsageSyntax *pMVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pMVar1 = (MacroUsageSyntax *)allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  directive.info = in_RSI;
  directive._0_8_ = in_RDX;
  slang::syntax::MacroUsageSyntax::MacroUsageSyntax
            ((MacroUsageSyntax *)in_RSI->location,directive,
             (MacroActualArgumentListSyntax *)in_RSI->rawTextPtr);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }